

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O0

void __thiscall IlmThread_2_5::ThreadPool::ThreadPool(ThreadPool *this,uint nthreads)

{
  Data *this_00;
  int in_ESI;
  undefined8 *in_RDI;
  Data *in_stack_ffffffffffffffb0;
  int count;
  DefaultThreadPoolProvider *this_01;
  
  *in_RDI = &PTR__ThreadPool_00111c08;
  this_01 = (DefaultThreadPoolProvider *)(in_RDI + 1);
  this_00 = (Data *)operator_new(0x10);
  count = (int)((ulong)in_RDI >> 0x20);
  Data::Data(in_stack_ffffffffffffffb0);
  (this_01->super_ThreadPoolProvider)._vptr_ThreadPoolProvider = (_func_int **)this_00;
  if (in_ESI == 0) {
    operator_new(8);
    anon_unknown_5::NullThreadPoolProvider::NullThreadPoolProvider
              ((NullThreadPoolProvider *)in_stack_ffffffffffffffb0);
    Data::setProvider(this_00,&this_01->super_ThreadPoolProvider);
  }
  else {
    operator_new(0xe0);
    anon_unknown_5::DefaultThreadPoolProvider::DefaultThreadPoolProvider(this_01,count);
    Data::setProvider(this_00,&this_01->super_ThreadPoolProvider);
  }
  return;
}

Assistant:

ThreadPool::ThreadPool (unsigned nthreads):
    _data (new Data)
{
    if ( nthreads == 0 )
        _data->setProvider( new NullThreadPoolProvider );
    else
        _data->setProvider( new DefaultThreadPoolProvider( int(nthreads) ) );
}